

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

DVector2 __thiscall AActor::Vec2To(AActor *this,AActor *other)

{
  AActor *in_RDX;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  DVector2 DVar1;
  DVector3 local_68;
  DVector3 local_50;
  TVector3<double> local_38;
  AActor *other_local;
  AActor *this_local;
  
  other_local = other;
  this_local = this;
  PosRelative(&local_50,in_RDX,other);
  Pos(&local_68,other);
  TVector3<double>::operator-(&local_38,&local_50,&local_68);
  TVector2<double>::TVector2((TVector2<double> *)this,&local_38);
  DVar1.Y = in_XMM1_Qa;
  DVar1.X = extraout_XMM0_Qa;
  return DVar1;
}

Assistant:

DVector2 Vec2To(AActor *other) const
	{
		return other->PosRelative(this) - Pos();
	}